

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VCloneEmptyVectorArray(int count,N_Vector W,int myid)

{
  N_Vector X;
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  timespec spec;
  timespec local_40;
  
  iVar1 = 1;
  clock_gettime(1,&local_40);
  lVar3 = local_40.tv_sec - base_time_tv_sec;
  dVar6 = (double)local_40.tv_nsec;
  lVar2 = N_VCloneEmptyVectorArray(count,W);
  clock_gettime(1,&local_40);
  if (count < 1 && lVar2 != 0) {
    printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n",(ulong)(uint)myid);
    printf("    count = %d, expected *vs = NULL \n\n",(ulong)(uint)count);
  }
  else {
    lVar5 = local_40.tv_sec - base_time_tv_sec;
    if (0 < count) {
      uVar4 = 0;
      do {
        X = *(N_Vector *)(lVar2 + uVar4 * 8);
        if (X == (N_Vector)0x0) {
          printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n",(ulong)(uint)myid);
          printf("    Vector[%d] = NULL \n\n",uVar4 & 0xffffffff);
LAB_001036ba:
          N_VDestroyVectorArray(lVar2,count);
          return 1;
        }
        iVar1 = has_data(X);
        if (iVar1 != 0) {
          printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n",(ulong)(uint)myid);
          printf("    Vector[%d] data != NULL \n\n",uVar4 & 0xffffffff);
          goto LAB_001036ba;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)count != uVar4);
    }
    N_VDestroyVectorArray(lVar2,count);
    if (myid == 0) {
      puts("PASSED test -- N_VCloneEmptyVectorArray ");
    }
    max_time(W,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar5) -
               (dVar6 / 1000000000.0 + (double)lVar3));
    iVar1 = 0;
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VCloneEmptyVectorArray");
    }
  }
  return iVar1;
}

Assistant:

int Test_N_VCloneEmptyVectorArray(int count, N_Vector W, int myid)
{
  int i;
  double start_time, stop_time, maxt;
  N_Vector* vs;

  /* clone empty array */
  start_time = get_time();
  vs         = N_VCloneEmptyVectorArray(count, W);
  stop_time  = get_time();

  /* check array of vectors */
  if (count <= 0 && vs != NULL)
  {
    printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n", myid);
    printf("    count = %d, expected *vs = NULL \n\n", count);
    return (1);
  }

  /* check vectors in array */
  for (i = 0; i < count; i++)
  {
    if (vs[i] == NULL)
    {
      printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n", myid);
      printf("    Vector[%d] = NULL \n\n", i);
      N_VDestroyVectorArray(vs, count);
      return (1);
    }

    if (has_data(vs[i]))
    {
      printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n", myid);
      printf("    Vector[%d] data != NULL \n\n", i);
      N_VDestroyVectorArray(vs, count);
      return (1);
    }
  }

  N_VDestroyVectorArray(vs, count);

  if (myid == 0) { printf("PASSED test -- N_VCloneEmptyVectorArray \n"); }

  /* find max time across all processes */
  maxt = max_time(W, stop_time - start_time);
  PRINT_TIME("N_VCloneEmptyVectorArray", maxt);

  return (0);
}